

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O1

void SStream_concat0(SStream *ss,char *s)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = strlen(s);
  memcpy(ss->buffer + ss->index,s,sVar1 & 0xffffffff);
  iVar2 = (int)sVar1 + ss->index;
  ss->index = iVar2;
  ss->buffer[iVar2] = '\0';
  return;
}

Assistant:

void SStream_concat0(SStream *ss, const char *s)
{
#ifndef CAPSTONE_DIET
	unsigned int len = (unsigned int) strlen(s);

	memcpy(ss->buffer + ss->index, s, len);
	ss->index += len;
	ss->buffer[ss->index] = '\0';
#endif
}